

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O3

bool __thiscall
sptk::Matrix::GetSubmatrix
          (Matrix *this,int row_offset,int num_row_of_submatrix,int column_offset,
          int num_column_of_submatrix,Matrix *submatrix)

{
  pointer ppdVar1;
  pointer ppdVar2;
  double *pdVar3;
  double *pdVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (num_row_of_submatrix < 1 || row_offset < 0) {
    bVar5 = false;
  }
  else {
    bVar5 = false;
    if (((0 < num_column_of_submatrix) && (bVar5 = false, -1 < column_offset)) &&
       (num_row_of_submatrix + row_offset <= this->num_row_)) {
      bVar5 = false;
      if (((this != submatrix) && (submatrix != (Matrix *)0x0)) &&
         (bVar5 = false, num_column_of_submatrix + column_offset <= this->num_column_)) {
        if ((submatrix->num_row_ != num_row_of_submatrix) ||
           (submatrix->num_column_ != num_column_of_submatrix)) {
          Resize(submatrix,num_row_of_submatrix,num_column_of_submatrix);
        }
        ppdVar1 = (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppdVar2 = (submatrix->index_).super__Vector_base<double_*,_std::allocator<double_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar6 = 0;
        do {
          pdVar3 = ppdVar2[uVar6];
          pdVar4 = ppdVar1[(uint)row_offset + uVar6];
          uVar7 = 0;
          do {
            pdVar3[uVar7] = pdVar4[(uint)column_offset + uVar7];
            uVar7 = uVar7 + 1;
          } while ((uint)num_column_of_submatrix != uVar7);
          uVar6 = uVar6 + 1;
        } while (uVar6 != (uint)num_row_of_submatrix);
        bVar5 = true;
      }
    }
  }
  return bVar5;
}

Assistant:

bool Matrix::GetSubmatrix(int row_offset, int num_row_of_submatrix,
                          int column_offset, int num_column_of_submatrix,
                          Matrix* submatrix) const {
  if (row_offset < 0 || num_row_of_submatrix <= 0 ||
      num_row_ < row_offset + num_row_of_submatrix || column_offset < 0 ||
      num_column_of_submatrix <= 0 ||
      num_column_ < column_offset + num_column_of_submatrix ||
      NULL == submatrix || this == submatrix) {
    return false;
  }

  if (submatrix->num_row_ != num_row_of_submatrix ||
      submatrix->num_column_ != num_column_of_submatrix) {
    submatrix->Resize(num_row_of_submatrix, num_column_of_submatrix);
  }

  for (int i(0); i < num_row_of_submatrix; ++i) {
    for (int j(0); j < num_column_of_submatrix; ++j) {
      submatrix->index_[i][j] = index_[row_offset + i][column_offset + j];
    }
  }

  return true;
}